

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_client.cpp
# Opt level: O0

int main(void)

{
  FILE *__stream;
  bool bVar1;
  undefined8 uVar2;
  undefined1 local_10b8 [8];
  Client client;
  int svr_port;
  allocator local_31;
  string local_30 [8];
  string svr_ip;
  int local_c;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"127.0.0.1",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  client._stdineof = true;
  client._4201_3_ = 0x23;
  Client::Client((Client *)local_10b8,(string *)local_30,0x2382);
  bVar1 = Client::conn_svr((Client *)local_10b8);
  __stream = _stderr;
  if (bVar1) {
    Client::run((Client *)local_10b8);
    local_c = 0;
  }
  else {
    uVar2 = std::__cxx11::string::c_str();
    fprintf(__stream,"%s(%d)-<%s>: connect to server[%s:%d] failed!\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/epoll_client.cpp"
            ,0xf,"main",uVar2,client._4200_4_);
    fflush(_stderr);
    local_c = -1;
  }
  Client::~Client((Client *)local_10b8);
  std::__cxx11::string::~string(local_30);
  return local_c;
}

Assistant:

int main()
{
    string svr_ip = "127.0.0.1";
    int svr_port = 9090;

    Client client(svr_ip, svr_port);

    if (client.conn_svr() == false)
    {
        LOG_PRINT("connect to server[%s:%d] failed!", svr_ip.c_str(), svr_port);
        return -1;
    }
    client.run();

    // int flags = fcntl(STDIN_FILENO, F_GETFL, 0);
    // fcntl(STDIN_FILENO, F_SETFL, flags | O_NONBLOCK);

    // const int MAX_EVENTS = 1024;
    // int epoll_fd;
    // epoll_fd = epoll_create(MAX_EVENTS);
    // if (epoll_fd < 0)
    // {
    //     perror("epoll_create failed");
    //     return -1;
    // }

    // struct epoll_event ev;
    // struct epoll_event events[MAX_EVENTS];
    
    // ev.data.fd = STDIN_FILENO;
    // ev.events = EPOLLIN;

    // int ret = epoll_ctl(epoll_fd, EPOLL_CTL_ADD, STDIN_FILENO, &ev);
    // if (ret < 0)
    // {
    //     perror("epoll_ctl: stdin register failed");
    //     return -1;
    // }

    // while (1)
    // {
    //     int nfds;

    //     nfds = epoll_wait(epoll_fd, events, MAX_EVENTS, 10000);
    //     printf("loop events number: %d\n", nfds);

    //     for (int i = 0; i < nfds; ++i)
    //     {
    //         if (events[i].events & EPOLLIN)
    //         {
    //             if (events[i].data.fd == STDIN_FILENO)
    //             {
    //                 Buff buf;
    //                 int n = read(STDIN_FILENO, buf._r_pos, buf.left_size());
    //                 if (n < 0)
    //                 {
    //                     return -1;
    //                 }
    //                 buf.set_r_pow(n);
    //                 n = write(STDOUT_FILENO, buf._w_pos, buf.data_size());
    //                 if (n < 0)
    //                 {
    //                     return -1;
    //                 }
    //                 buf.set_w_pos(n);
    //             }
    //         }
    //     }
    // }

    return 0;
}